

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LowerTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lowertriangular
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x528) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x528;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.lowertriangular_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::LowerTriangularLayerParams>(arena);
    (this->layer_).lowertriangular_ = (LowerTriangularLayerParams *)LVar2;
  }
  return (LowerTriangularLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LowerTriangularLayerParams* NeuralNetworkLayer::_internal_mutable_lowertriangular() {
  if (!_internal_has_lowertriangular()) {
    clear_layer();
    set_has_lowertriangular();
    layer_.lowertriangular_ = CreateMaybeMessage< ::CoreML::Specification::LowerTriangularLayerParams >(GetArenaForAllocation());
  }
  return layer_.lowertriangular_;
}